

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

void * __thiscall
lossless_neural_sound::expression_compiler::Arena::
allocate<lossless_neural_sound::expression_compiler::Arena::Node<lossless_neural_sound::expression_compiler::expression::Sum>>
          (Arena *this)

{
  ulong uVar1;
  iterator *piVar2;
  ulong uVar3;
  uchar *puVar4;
  _Elt_pointer pMVar5;
  _Elt_pointer pMVar6;
  
  pMVar6 = (this->memory_blocks).
           super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pMVar6 != (this->memory_blocks).
                super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pMVar5 = pMVar6;
    if (pMVar6 == (this->memory_blocks).
                  super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pMVar5 = (this->memory_blocks).
               super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 1;
    }
    uVar3 = pMVar5[-1].used + 7 & 0xfffffffffffffff8;
    uVar1 = uVar3 + 0x50;
    if (uVar1 < 0x1001) {
      puVar4 = pMVar5[-1].bytes + uVar3;
      pMVar5[-1].used = uVar1;
      goto LAB_0011be94;
    }
  }
  puVar4 = (uchar *)0x0;
LAB_0011be94:
  if (puVar4 == (uchar *)0x0) {
    if (pMVar6 == (this->memory_blocks).
                  super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
      ::_M_push_back_aux<>(&this->memory_blocks);
    }
    else {
      memset(pMVar6,0,0x1010);
      piVar2 = &(this->memory_blocks).
                super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar2->_M_cur = piVar2->_M_cur + 1;
    }
    pMVar6 = (this->memory_blocks).
             super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pMVar6 == (this->memory_blocks).
                  super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pMVar6 = (this->memory_blocks).
               super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 1;
    }
    uVar3 = pMVar6[-1].used + 7 & 0xfffffffffffffff8;
    uVar1 = uVar3 + 0x50;
    if (uVar1 < 0x1001) {
      puVar4 = pMVar6[-1].bytes + uVar3;
      pMVar6[-1].used = uVar1;
    }
    else {
      puVar4 = (uchar *)0x0;
    }
  }
  if (puVar4 != (uchar *)0x0) {
    return puVar4;
  }
  __assert_fail("retval",
                "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/arena.h"
                ,0x6f,
                "void *lossless_neural_sound::expression_compiler::Arena::allocate() [T = lossless_neural_sound::expression_compiler::Arena::Node<lossless_neural_sound::expression_compiler::expression::Sum>]"
               );
}

Assistant:

void *allocate()
    {
        static_assert(alignof(T) <= memory_block_alignment, "");
        static_assert(is_nonzero_power_of_2(alignof(T)), "");
        assert(sizeof(T) < big_memory_block_start_size);
        void *retval = memory_blocks.empty() ?
                           nullptr :
                           memory_blocks.back().allocate<sizeof(T), alignof(T)>();
        if(!retval)
        {
            memory_blocks.emplace_back();
            retval = memory_blocks.back().allocate<sizeof(T), alignof(T)>();
        }
        assert(retval);
        return retval;
    }